

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::EnumTypeSyntax::setChild(EnumTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0046afd4 + *(int *)(&DAT_0046afd4 + index * 4)))();
  return;
}

Assistant:

void EnumTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: baseType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: openBrace = child.token(); return;
        case 3: members = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 4: closeBrace = child.token(); return;
        case 5: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}